

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.cxx
# Opt level: O0

void cmEventBasedConnection::on_read(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  long *plVar1;
  char *__beg;
  _func_int **pp_Var2;
  allocator<char> local_49;
  string local_48 [32];
  long *local_28;
  cmEventBasedConnection *conn;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *stream_local;
  
  plVar1 = (long *)stream->data;
  local_28 = plVar1;
  conn = (cmEventBasedConnection *)buf;
  buf_local = (uv_buf_t *)nread;
  nread_local = (ssize_t)stream;
  if (plVar1 != (long *)0x0) {
    if (nread < 0) {
      (**(code **)(*plVar1 + 0x50))(plVar1,nread & 0xffffffff);
    }
    else {
      __beg = buf->base;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char*,void>(local_48,__beg,__beg + nread,&local_49);
      (**(code **)(*plVar1 + 0x48))(plVar1,local_48);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator(&local_49);
    }
  }
  pp_Var2 = (conn->super_cmConnection)._vptr_cmConnection;
  if (pp_Var2 != (_func_int **)0x0) {
    operator_delete__(pp_Var2);
  }
  return;
}

Assistant:

void cmEventBasedConnection::on_read(uv_stream_t* stream, ssize_t nread,
                                     const uv_buf_t* buf)
{
  auto conn = static_cast<cmEventBasedConnection*>(stream->data);
  if (conn) {
    if (nread >= 0) {
      conn->ReadData(std::string(buf->base, buf->base + nread));
    } else {
      conn->OnDisconnect(static_cast<int>(nread));
    }
  }

  delete[](buf->base);
}